

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

uint32_t libyuv::SumPixels_16(int iboxwidth,uint32_t *src_ptr)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)iboxwidth;
  if (iboxwidth < 1) {
    uVar3 = uVar2;
  }
  uVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 + src_ptr[uVar2];
  }
  return uVar1;
}

Assistant:

static __inline uint32_t SumPixels_16(int iboxwidth, const uint32_t* src_ptr) {
  uint32_t sum = 0u;
  int x;
  assert(iboxwidth > 0);
  for (x = 0; x < iboxwidth; ++x) {
    sum += src_ptr[x];
  }
  return sum;
}